

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_target(TARGET_HANDLE target)

{
  TARGET_INSTANCE *target_instance;
  AMQP_VALUE result;
  TARGET_HANDLE target_local;
  
  if (target == (TARGET_HANDLE)0x0) {
    target_instance = (TARGET_INSTANCE *)0x0;
  }
  else {
    target_instance = (TARGET_INSTANCE *)amqpvalue_clone(target->composite_value);
  }
  return (AMQP_VALUE)target_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_target(TARGET_HANDLE target)
{
    AMQP_VALUE result;

    if (target == NULL)
    {
        result = NULL;
    }
    else
    {
        TARGET_INSTANCE* target_instance = (TARGET_INSTANCE*)target;
        result = amqpvalue_clone(target_instance->composite_value);
    }

    return result;
}